

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Validator * __thiscall CLI::Validator::description(Validator *this,string *validator_desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Validator *in_RDI;
  anon_class_32_1_5ff8519c *in_stack_ffffffffffffffc8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  ::std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffe8);
  ::std::function<std::__cxx11::string()>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  description(std::__cxx11::string)::{lambda()#1}::~basic_string
            ((anon_class_32_1_5ff8519c *)0x1c8052);
  return in_RDI;
}

Assistant:

Validator &description(std::string validator_desc) {
        desc_function_ = [validator_desc]() { return validator_desc; };
        return *this;
    }